

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

bool __thiscall
Matrix::CopyColumn(Matrix *this,Matrix *source_matrix,int source_column,int destination_column)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  Fraction *pFVar4;
  long lVar5;
  long lVar6;
  
  if (this->n_ < 1) {
    bVar3 = false;
  }
  else {
    lVar6 = 0;
    lVar5 = 0;
    bVar3 = false;
    do {
      lVar1 = *(long *)((long)&(((this->elements_).
                                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                               super__Vector_impl_data + lVar6);
      pFVar4 = At(source_matrix,(int)lVar5,source_column);
      bVar2 = operator!=((Fraction *)(lVar1 + (long)destination_column * 8),pFVar4);
      if (bVar2) {
        pFVar4 = At(source_matrix,(int)lVar5,source_column);
        *(Fraction *)
         (*(long *)((long)&(((this->elements_).
                             super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                           super__Vector_impl_data + lVar6) + (long)destination_column * 8) =
             *pFVar4;
        bVar3 = true;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x18;
    } while (lVar5 < this->n_);
  }
  return bVar3;
}

Assistant:

bool Matrix::CopyColumn(const Matrix& source_matrix, int source_column, int destination_column) {
  bool result = false;
  for (int row = 0; row < n_; ++row) {
    if (elements_[row][destination_column] != source_matrix.At(row, source_column)) {
      result = true;
      elements_[row][destination_column] = source_matrix.At(row, source_column);
    }
  }

  return result;
}